

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

longlong unshield_fsize(Unshield *unshield,FILE *file)

{
  long offset;
  long lVar1;
  longlong previous;
  longlong result;
  FILE *file_local;
  Unshield *unshield_local;
  
  offset = unshield_ftell(unshield,file);
  unshield_fseek(unshield,file,0,2);
  lVar1 = unshield_ftell(unshield,file);
  unshield_fseek(unshield,file,offset,0);
  return lVar1;
}

Assistant:

long long unshield_fsize(Unshield* unshield, FILE* file)
{
  long long result;
  long long previous = unshield_ftell(unshield, file);
  unshield_fseek(unshield, file, 0L, SEEK_END);
  result = unshield_ftell(unshield, file);
  unshield_fseek(unshield, file, previous, SEEK_SET);
  return result;
}